

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<SubArray,Macro>::emplace<Macro_const&>(QHash<SubArray,Macro> *this,SubArray *key,Macro *args)

{
  undefined1 uVar1;
  undefined1 uVar2;
  Data *pDVar3;
  undefined8 uVar4;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *pDVar5;
  long in_FS_OFFSET;
  piter pVar6;
  Macro local_68;
  long local_30;
  
  uVar4 = local_68._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *(Data **)this;
  if (pDVar3 == (Data *)0x0) {
LAB_0011fd68:
    pDVar5 = *(Data<QHashPrivate::Node<SubArray,_Macro>_> **)this;
    local_68._0_8_ = pDVar3;
    if ((pDVar5 == (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) ||
       (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::detached(pDVar5);
      *(Data<QHashPrivate::Node<SubArray,_Macro>_> **)this = pDVar5;
    }
    pVar6 = (piter)emplace_helper<Macro_const&>(this,key,args);
    QHash<SubArray,_Macro>::~QHash((QHash<SubArray,_Macro> *)&local_68);
  }
  else {
    if (1 < *(uint *)&pDVar3->ref) {
      if ((pDVar3 != (Data *)0x0) && (*(uint *)&pDVar3->ref != 0xffffffff)) {
        LOCK();
        pDVar3->ref = (RefCount)(*(uint *)&pDVar3->ref + 1);
        UNLOCK();
      }
      goto LAB_0011fd68;
    }
    if (pDVar3->size < pDVar3->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        pVar6 = (piter)emplace_helper<Macro_const&>(this,key,args);
        return (iterator)pVar6;
      }
      goto LAB_0011fe41;
    }
    uVar1 = args->isFunction;
    uVar2 = args->isVariadic;
    local_68.isVariadic = (bool)uVar2;
    local_68.isFunction = (bool)uVar1;
    local_68._2_6_ = SUB86(uVar4,2);
    local_68.arguments.d.d = (args->arguments).d.d;
    local_68.arguments.d.ptr = (args->arguments).d.ptr;
    local_68.arguments.d.size = (args->arguments).d.size;
    if (local_68.arguments.d.d != (Data *)0x0) {
      LOCK();
      ((local_68.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.arguments.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_68.symbols.d.d = (args->symbols).d.d;
    local_68.symbols.d.ptr = (args->symbols).d.ptr;
    local_68.symbols.d.size = (args->symbols).d.size;
    if (local_68.symbols.d.d != (Data *)0x0) {
      LOCK();
      ((local_68.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    pVar6 = (piter)QHash<SubArray,_Macro>::emplace_helper<Macro>
                             ((QHash<SubArray,_Macro> *)this,key,&local_68);
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_68.symbols.d);
    QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_68.arguments.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar6;
  }
LAB_0011fe41:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }